

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 24点.cpp
# Opt level: O0

bool jiesuan(int a,int b,int c,int d,string *cal)

{
  char *pcVar1;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  string *in_R8;
  double dVar4;
  int k;
  int j;
  int i;
  string pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  int local_60;
  int local_5c;
  int local_58;
  allocator local_41;
  string local_40 [32];
  string *local_20;
  int local_14;
  int local_10;
  int local_c;
  int local_8;
  byte local_1;
  char __rhs_00;
  
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"+-*/",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_58 = 0;
  do {
    if (3 < local_58) {
      local_1 = 0;
LAB_0010a283:
      std::__cxx11::string::~string(local_40);
      return (bool)(local_1 & 1);
    }
    for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
      for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
        dVar4 = (double)local_8;
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
        dVar4 = cal_24(dVar4,*pcVar1,(double)local_c);
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
        dVar4 = cal_24(dVar4,*pcVar1,(double)local_10);
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
        dVar4 = cal_24(dVar4,*pcVar1,(double)local_14);
        if ((dVar4 == 24.0) && (!NAN(dVar4))) {
          pvVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&poker_dict_abi_cxx11_,(long)(local_8 + -1));
          __rhs_00 = (char)((ulong)pvVar2 >> 0x38);
          pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::__cxx11::string::operator[]((ulong)local_40);
          std::operator+(pbVar3,__rhs_00);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&poker_dict_abi_cxx11_,(long)(local_c + -1));
          std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
          pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::__cxx11::string::operator[]((ulong)local_40);
          std::operator+(pbVar3,(char)((ulong)in_stack_fffffffffffffe80 >> 0x38));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&poker_dict_abi_cxx11_,(long)(local_10 + -1));
          std::operator+(pbVar3,in_stack_fffffffffffffe80);
          __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::__cxx11::string::operator[]((ulong)local_40);
          std::operator+(pbVar3,(char)((ulong)__rhs >> 0x38));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&poker_dict_abi_cxx11_,(long)(local_14 + -1));
          std::operator+(pbVar3,__rhs);
          std::__cxx11::string::operator=(local_20,local_80);
          std::__cxx11::string::~string(local_80);
          std::__cxx11::string::~string(local_a0);
          std::__cxx11::string::~string(local_c0);
          std::__cxx11::string::~string(local_e0);
          std::__cxx11::string::~string(local_100);
          std::__cxx11::string::~string(local_120);
          local_1 = 1;
          goto LAB_0010a283;
        }
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

bool jiesuan(int a,int b,int c,int d, string &  cal)
{
    string pos="+-*/";
    for (int i=0;i<4;i++)
    {
        for (int j=0;j<4;j++)
        {
            for (int k=0;k<4;k++)
            {
               if (cal_24(cal_24(cal_24(a,pos[i],b),pos[j],c),pos[k],d) == 24.0000)
               {
                   cal = poker_dict[a-1]+pos[i]+poker_dict[b-1]+pos[j]+poker_dict[c-1]+pos[k]+poker_dict[d-1];
                   return true;
               } 
            }
        }
    }
    return false;
}